

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_defs.h
# Opt level: O1

DVector3 * __thiscall
AActor::PosRelative(DVector3 *__return_storage_ptr__,AActor *this,sector_t *sec)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = (this->__Pos).Y;
  dVar2 = (this->__Pos).Z;
  iVar3 = this->Sector->PortalGroup;
  dVar4 = 0.0;
  dVar5 = 0.0;
  if (iVar3 != sec->PortalGroup) {
    iVar3 = sec->PortalGroup * Displacements.size + iVar3;
    dVar4 = Displacements.data.Array[iVar3].pos.X;
    dVar5 = Displacements.data.Array[iVar3].pos.Y;
  }
  __return_storage_ptr__->X = (this->__Pos).X + dVar4;
  __return_storage_ptr__->Y = dVar1 + dVar5;
  __return_storage_ptr__->Z = dVar2;
  return __return_storage_ptr__;
}

Assistant:

inline DVector3 AActor::PosRelative(sector_t *sec) const
{
	return Pos() + Displacements.getOffset(Sector->PortalGroup, sec->PortalGroup);
}